

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labelling.cc
# Opt level: O2

Label * labelling::processBwdLabel
                  (Label *__return_storage_ptr__,Label *label,
                  vector<double,_std::allocator<double>_> *max_res,
                  vector<double,_std::allocator<double>_> *cumulative_resource,bool *invert_min_res)

{
  int iVar1;
  Params *params_ptr_in;
  vector<double,_std::allocator<double>_> new_resources;
  vector<int,_std::allocator<int>_> new_path;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,&label->partial_path);
  std::__reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (local_48._M_impl.super__Vector_impl_data._M_start,
             local_48._M_impl.super__Vector_impl_data._M_finish);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,&label->resource_consumption);
  params_ptr_in = label->params_ptr;
  iVar1 = params_ptr_in->critical_res;
  local_60._M_impl.super__Vector_impl_data._M_start[iVar1] =
       (max_res->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_start[iVar1] -
       local_60._M_impl.super__Vector_impl_data._M_start[iVar1];
  if (*invert_min_res == false) {
    std::
    transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
              (local_60._M_impl.super__Vector_impl_data._M_start,
               local_60._M_impl.super__Vector_impl_data._M_finish,
               (cumulative_resource->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    params_ptr_in = label->params_ptr;
  }
  Label::Label(__return_storage_ptr__,&label->weight,&label->vertex,
               (vector<double,_std::allocator<double>_> *)&local_60,
               (vector<int,_std::allocator<int>_> *)&local_48,params_ptr_in);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Label processBwdLabel(
    const labelling::Label&    label,
    const std::vector<double>& max_res,
    const std::vector<double>& cumulative_resource,
    const bool&                invert_min_res) {
  // Invert path
  std::vector<int> new_path = label.partial_path;
  std::reverse(new_path.begin(), new_path.end());
  // Init resources
  std::vector<double> new_resources(label.resource_consumption);
  // Invert monotone resource
  const int& c_res     = label.params_ptr->critical_res;
  new_resources[c_res] = max_res[c_res] - new_resources[c_res];

  if (!invert_min_res) {
    // Elementwise cumulative_resource + new_resources
    std::transform(
        new_resources.begin(),
        new_resources.end(),
        cumulative_resource.begin(),
        new_resources.begin(),
        std::plus<double>());
  }
  return Label(
      label.weight, label.vertex, new_resources, new_path, label.params_ptr);
}